

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O1

BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> * __thiscall
gmlc::containers::
DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
          (BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> *__return_storage_ptr__,
          DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
          *this,InterfaceHandle *searchValue)

{
  __node_base_ptr p_Var1;
  Endpoint **ppEVar2;
  int iVar3;
  Endpoint *pEVar4;
  uint uVar5;
  _Hash_node_base *p_Var6;
  
  p_Var6 = (_Hash_node_base *)0x0;
  p_Var1 = std::
           _Hashtable<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::InterfaceHandle>,_std::hash<helics::InterfaceHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->lookup2)._M_h,
                      (ulong)(long)searchValue->hid % (this->lookup2)._M_h._M_bucket_count,
                      searchValue,(long)searchValue->hid);
  if (p_Var1 != (__node_base_ptr)0x0) {
    p_Var6 = p_Var1->_M_nxt;
  }
  if (p_Var6 == (_Hash_node_base *)0x0) {
    StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::end
              (__return_storage_ptr__,&this->dataStorage);
    return __return_storage_ptr__;
  }
  if ((this->dataStorage).csize == 0) {
    iVar3 = (this->dataStorage).bsize;
    ppEVar2 = (this->dataStorage).dataptr;
    if ((long)iVar3 != 0x20) {
      ppEVar2 = ppEVar2 + (this->dataStorage).dataSlotIndex;
      pEVar4 = *ppEVar2 + iVar3;
      goto LAB_001ef3e7;
    }
    if (ppEVar2 == (Endpoint **)0x0) {
      ppEVar2 = &StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::end::
                 emptyValue;
    }
    else {
      ppEVar2 = ppEVar2 + (long)(this->dataStorage).dataSlotIndex + 1;
    }
  }
  else {
    ppEVar2 = (this->dataStorage).dataptr;
  }
  pEVar4 = *ppEVar2;
  iVar3 = 0;
LAB_001ef3e7:
  p_Var6 = p_Var6[2]._M_nxt;
  __return_storage_ptr__->vec = ppEVar2;
  __return_storage_ptr__->ptr = pEVar4 + (long)p_Var6;
  uVar5 = (int)p_Var6 + iVar3;
  __return_storage_ptr__->offset = uVar5;
  if (0x1f < (int)uVar5) {
    __return_storage_ptr__->vec = ppEVar2 + (ulong)(uVar5 - 0x20 >> 5) + 1;
    __return_storage_ptr__->offset = uVar5 & 0x1f;
    __return_storage_ptr__->ptr = ppEVar2[(ulong)(uVar5 - 0x20 >> 5) + 1] + (uVar5 & 0x1f);
  }
  return __return_storage_ptr__;
}

Assistant:

auto find(const searchType2& searchValue)
        {
            auto fnd = lookup2.find(searchValue);
            if (fnd != lookup2.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }